

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O2

String * __thiscall
Rml::DataViewText::BuildText_abi_cxx11_(String *__return_storage_ptr__,DataViewText *this)

{
  pointer pDVar1;
  DataEntry *entry;
  pointer pDVar2;
  ulong uVar3;
  string local_50 [32];
  
  for (pDVar2 = (this->data_entries).
                super__Vector_base<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pDVar2 != (this->data_entries).
                super__Vector_base<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish; pDVar2 = pDVar2 + 1) {
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pDVar1 = (this->data_entries).
           super__Vector_base<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = 0;
  for (pDVar2 = (this->data_entries).
                super__Vector_base<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>
                ._M_impl.super__Vector_impl_data._M_start; pDVar2 != pDVar1; pDVar2 = pDVar2 + 1) {
    ::std::__cxx11::string::substr((ulong)local_50,(ulong)&this->text);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string(local_50);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    uVar3 = pDVar2->index;
  }
  if (uVar3 < (this->text)._M_string_length) {
    ::std::__cxx11::string::substr((ulong)local_50,(ulong)&this->text);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

String DataViewText::BuildText() const
{
	size_t reserve_size = text.size();

	for (const DataEntry& entry : data_entries)
		reserve_size += entry.value.size();

	String result;
	result.reserve(reserve_size);

	size_t previous_index = 0;
	for (const DataEntry& entry : data_entries)
	{
		result += text.substr(previous_index, entry.index - previous_index);
		result += entry.value;
		previous_index = entry.index;
	}

	if (previous_index < text.size())
		result += text.substr(previous_index);

	return result;
}